

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantArray.cc
# Opt level: O1

LiteralType __thiscall
flow::ConstantArray::makeArrayType(ConstantArray *this,LiteralType elementType)

{
  LiteralType LVar1;
  
  switch(elementType) {
  default:
    abort();
  case Number:
    LVar1 = IntArray;
    break;
  case String:
    LVar1 = StringArray;
    break;
  case IPAddress:
    LVar1 = IPAddrArray;
    break;
  case Cidr:
    LVar1 = CidrArray;
  }
  return LVar1;
}

Assistant:

LiteralType ConstantArray::makeArrayType(LiteralType elementType) {
  switch (elementType) {
    case LiteralType::Number:
      return LiteralType::IntArray;
    case LiteralType::String:
      return LiteralType::StringArray;
    case LiteralType::IPAddress:
      return LiteralType::IPAddrArray;
    case LiteralType::Cidr:
      return LiteralType::CidrArray;
    case LiteralType::Boolean:
    case LiteralType::RegExp:
    case LiteralType::Handler:
    case LiteralType::IntArray:
    case LiteralType::StringArray:
    case LiteralType::IPAddrArray:
    case LiteralType::CidrArray:
    case LiteralType::Void:
      abort();
    default:
      abort();
  }
}